

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlTextReaderPtr xmlReaderForFd(int fd,char *URL,char *encoding,int options)

{
  int iVar1;
  xmlParserInputBufferPtr input;
  xmlTextReaderPtr reader;
  
  if (-1 < fd) {
    input = xmlParserInputBufferCreateFd(fd,XML_CHAR_ENCODING_NONE);
    if (input == (xmlParserInputBufferPtr)0x0) {
      return (xmlTextReaderPtr)0x0;
    }
    input->closecallback = (xmlInputCloseCallback)0x0;
    reader = xmlNewTextReader(input,URL);
    if (reader == (xmlTextReaderPtr)0x0) {
      xmlFreeParserInputBuffer(input);
    }
    else {
      *(byte *)&reader->allocs = (byte)reader->allocs | 1;
      iVar1 = xmlTextReaderSetup(reader,(xmlParserInputBufferPtr)0x0,URL,encoding,options);
      if (-1 < iVar1) {
        return reader;
      }
      xmlFreeTextReader(reader);
    }
  }
  return (xmlTextReaderPtr)0x0;
}

Assistant:

xmlTextReaderPtr
xmlReaderForFd(int fd, const char *URL, const char *encoding, int options)
{
    xmlTextReaderPtr reader;
    xmlParserInputBufferPtr input;

    if (fd < 0)
        return (NULL);

    input = xmlParserInputBufferCreateFd(fd, XML_CHAR_ENCODING_NONE);
    if (input == NULL)
        return (NULL);
    input->closecallback = NULL;
    reader = xmlNewTextReader(input, URL);
    if (reader == NULL) {
        xmlFreeParserInputBuffer(input);
        return (NULL);
    }
    reader->allocs |= XML_TEXTREADER_INPUT;
    if (xmlTextReaderSetup(reader, NULL, URL, encoding, options) < 0) {
        xmlFreeTextReader(reader);
        return (NULL);
    }
    return (reader);
}